

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_rawset(jit_State *J,RecordFFData *rd)

{
  TValue local_128;
  RecordIndex ix;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  ix.oldv._0_4_ = *J->base;
  ix.oldv._4_4_ = J->base[1];
  ix.tab = J->base[2];
  if (((((uint)ix.oldv & 0x1f000000) == 0xb000000) && (ix.oldv._4_4_ != 0)) && (ix.tab != 0)) {
    ix.mt = 0;
    local_128.u64 = rd->argv->u64 & 0x7fffffffffff | 0xfffa000000000000;
    ix.tabv = rd->argv[1];
    ix.keyv = rd->argv[2];
    ix._64_8_ = rd;
    lj_record_idx(J,(RecordIndex *)&local_128.gcr);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_rawset(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0]; ix.key = J->base[1]; ix.val = J->base[2];
  if (tref_istab(ix.tab) && ix.key && ix.val) {
    ix.idxchain = 0;
    settabV(J->L, &ix.tabv, tabV(&rd->argv[0]));
    copyTV(J->L, &ix.keyv, &rd->argv[1]);
    copyTV(J->L, &ix.valv, &rd->argv[2]);
    lj_record_idx(J, &ix);
    /* Pass through table at J->base[0] as result. */
  }  /* else: Interpreter will throw. */
}